

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O2

void __thiscall
Imath_2_5::Box<Imath_2_5::Vec3<int>_>::extendBy
          (Box<Imath_2_5::Vec3<int>_> *this,Box<Imath_2_5::Vec3<int>_> *box)

{
  int iVar1;
  
  iVar1 = (box->min).x;
  if (iVar1 < (this->min).x) {
    (this->min).x = iVar1;
  }
  iVar1 = (box->max).x;
  if ((this->max).x < iVar1) {
    (this->max).x = iVar1;
  }
  iVar1 = (box->min).y;
  if (iVar1 < (this->min).y) {
    (this->min).y = iVar1;
  }
  iVar1 = (box->max).y;
  if ((this->max).y < iVar1) {
    (this->max).y = iVar1;
  }
  iVar1 = (box->min).z;
  if (iVar1 < (this->min).z) {
    (this->min).z = iVar1;
  }
  iVar1 = (box->max).z;
  if ((this->max).z < iVar1) {
    (this->max).z = iVar1;
  }
  return;
}

Assistant:

inline void
Box<Vec3<T> >::extendBy (const Box<Vec3<T> > &box)
{
    if (box.min[0] < min[0])
        min[0] = box.min[0];

    if (box.max[0] > max[0])
        max[0] = box.max[0];

    if (box.min[1] < min[1])
        min[1] = box.min[1];

    if (box.max[1] > max[1])
        max[1] = box.max[1];

    if (box.min[2] < min[2])
        min[2] = box.min[2];

    if (box.max[2] > max[2])
        max[2] = box.max[2];
}